

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O1

void __thiscall wabt::OptionParser::PrintHelp(OptionParser *this)

{
  ulong *puVar1;
  size_type sVar2;
  size_type sVar3;
  pointer pcVar4;
  Option *option;
  pointer pAVar5;
  pointer pOVar6;
  long *plVar7;
  long *plVar8;
  undefined8 *puVar9;
  char cVar10;
  ulong uVar11;
  pointer pOVar12;
  iterator __begin1;
  pointer pOVar13;
  ulong uVar14;
  long lVar15;
  __string_type __str;
  string flag;
  string line;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  undefined1 *local_98;
  ulong local_90;
  undefined1 local_88 [16];
  ulong *local_78;
  long local_70;
  ulong local_68;
  long lStack_60;
  char *local_58;
  undefined8 local_50;
  char local_48 [16];
  pointer local_38;
  
  printf("usage: %s [options]",(this->program_name_)._M_dataplus._M_p);
  pAVar5 = (this->arguments_).
           super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->arguments_).
      super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
      ._M_impl.super__Vector_impl_data._M_finish != pAVar5) {
    lVar15 = 0x20;
    uVar14 = 0;
    do {
      uVar11 = (ulong)*(uint *)((long)&(pAVar5->name)._M_dataplus._M_p + lVar15);
      if (uVar11 < 3) {
        printf(&DAT_001d7cc0 + *(int *)(&DAT_001d7cc0 + uVar11 * 4),
               *(undefined8 *)((long)pAVar5 + lVar15 + -0x20));
      }
      uVar14 = uVar14 + 1;
      pAVar5 = (this->arguments_).
               super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar15 = lVar15 + 0x50;
    } while (uVar14 < (ulong)(((long)(this->arguments_).
                                     super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar5 >> 4)
                             * -0x3333333333333333));
  }
  puts("\n");
  puts((this->description_)._M_dataplus._M_p);
  puts("options:");
  pOVar13 = (this->options_).
            super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pOVar12 = (this->options_).
            super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pOVar13 == pOVar12) {
    cVar10 = '\n';
  }
  else {
    uVar14 = 0;
    pOVar6 = pOVar13;
    do {
      sVar2 = (pOVar6->long_name)._M_string_length;
      if (sVar2 != 0) {
        sVar3 = (pOVar6->metavar)._M_string_length;
        lVar15 = sVar3 + 1;
        if (sVar3 == 0) {
          lVar15 = 0;
        }
        uVar11 = lVar15 + sVar2;
        if (uVar14 < uVar11) {
          uVar14 = uVar11;
        }
      }
      pOVar6 = pOVar6 + 1;
    } while (pOVar6 != pOVar12);
    cVar10 = (char)uVar14 + '\n';
  }
  if (pOVar13 != pOVar12) {
    local_38 = pOVar12;
    do {
      if ((pOVar13->short_name != '\0') || ((pOVar13->long_name)._M_string_length != 0)) {
        local_58 = local_48;
        local_50 = 0;
        local_48[0] = '\0';
        if (pOVar13->short_name == '\0') {
          std::__cxx11::string::append((char *)&local_58);
        }
        else {
          local_98 = local_88;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"  -","");
          plVar7 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_98,local_90,0,'\x01');
          plVar8 = plVar7 + 2;
          if ((long *)*plVar7 == plVar8) {
            local_a8 = *plVar8;
            lStack_a0 = plVar7[3];
            local_b8 = &local_a8;
          }
          else {
            local_a8 = *plVar8;
            local_b8 = (long *)*plVar7;
          }
          local_b0 = plVar7[1];
          *plVar7 = (long)plVar8;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_b8);
          puVar1 = (ulong *)(plVar8 + 2);
          if ((ulong *)*plVar8 == puVar1) {
            local_68 = *puVar1;
            lStack_60 = plVar8[3];
            local_78 = &local_68;
          }
          else {
            local_68 = *puVar1;
            local_78 = (ulong *)*plVar8;
          }
          local_70 = plVar8[1];
          *plVar8 = (long)puVar1;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78);
          if (local_78 != &local_68) {
            operator_delete(local_78);
          }
          if (local_b8 != &local_a8) {
            operator_delete(local_b8);
          }
          if (local_98 != local_88) {
            operator_delete(local_98);
          }
        }
        local_70 = 0;
        local_68 = local_68 & 0xffffffffffffff00;
        local_78 = &local_68;
        if ((pOVar13->long_name)._M_string_length != 0) {
          std::__cxx11::string::_M_replace((ulong)&local_78,0,(char *)0x0,0x1d7e0c);
          if ((pOVar13->metavar)._M_string_length == 0) {
            std::__cxx11::string::_M_append
                      ((char *)&local_78,(ulong)(pOVar13->long_name)._M_dataplus._M_p);
          }
          else {
            local_98 = local_88;
            pcVar4 = (pOVar13->long_name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_98,pcVar4,pcVar4 + (pOVar13->long_name)._M_string_length);
            std::__cxx11::string::_M_replace_aux((ulong)&local_98,local_90,0,'\x01');
            puVar9 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_98,(ulong)(pOVar13->metavar)._M_dataplus._M_p);
            plVar8 = puVar9 + 2;
            if ((long *)*puVar9 == plVar8) {
              local_a8 = *plVar8;
              lStack_a0 = puVar9[3];
              local_b8 = &local_a8;
            }
            else {
              local_a8 = *plVar8;
              local_b8 = (long *)*puVar9;
            }
            local_b0 = puVar9[1];
            *puVar9 = plVar8;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_b8);
            if (local_b8 != &local_a8) {
              operator_delete(local_b8);
            }
            if (local_98 != local_88) {
              operator_delete(local_98);
            }
          }
        }
        local_98 = local_88;
        std::__cxx11::string::_M_construct((ulong)&local_98,cVar10 - (char)local_70);
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_78);
        plVar8 = puVar9 + 2;
        if ((long *)*puVar9 == plVar8) {
          local_a8 = *plVar8;
          lStack_a0 = puVar9[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *plVar8;
          local_b8 = (long *)*puVar9;
        }
        local_b0 = puVar9[1];
        *puVar9 = plVar8;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_b8);
        if (local_b8 != &local_a8) {
          operator_delete(local_b8);
        }
        if (local_98 != local_88) {
          operator_delete(local_98);
        }
        if ((pOVar13->help)._M_string_length != 0) {
          std::__cxx11::string::_M_append((char *)&local_58,(ulong)(pOVar13->help)._M_dataplus._M_p)
          ;
        }
        puts(local_58);
        if (local_78 != &local_68) {
          operator_delete(local_78);
        }
        pOVar12 = local_38;
        if (local_58 != local_48) {
          operator_delete(local_58);
          pOVar12 = local_38;
        }
      }
      pOVar13 = pOVar13 + 1;
    } while (pOVar13 != pOVar12);
  }
  return;
}

Assistant:

void OptionParser::PrintHelp() {
  printf("usage: %s [options]", program_name_.c_str());

  for (size_t i = 0; i < arguments_.size(); ++i) {
    Argument& argument = arguments_[i];
    switch (argument.count) {
      case ArgumentCount::One:
        printf(" %s", argument.name.c_str());
        break;

      case ArgumentCount::OneOrMore:
        printf(" %s+", argument.name.c_str());
        break;

      case ArgumentCount::ZeroOrMore:
        printf(" [%s]...", argument.name.c_str());
        break;
    }
  }

  printf("\n\n");
  printf("%s\n", description_.c_str());
  printf("options:\n");

  const size_t kExtraSpace = 8;
  size_t longest_name_length = 0;
  for (const Option& option : options_) {
    size_t length;
    if (!option.long_name.empty()) {
      length = option.long_name.size();
      if (!option.metavar.empty()) {
        // +1 for '='.
        length += option.metavar.size() + 1;
      }
    } else {
      continue;
    }

    if (length > longest_name_length) {
      longest_name_length = length;
    }
  }

  for (const Option& option : options_) {
    if (!option.short_name && option.long_name.empty()) {
      continue;
    }

    std::string line;
    if (option.short_name) {
      line += std::string("  -") + option.short_name + ", ";
    } else {
      line += "      ";
    }

    std::string flag;
    if (!option.long_name.empty()) {
      flag = "--";
      if (!option.metavar.empty()) {
        flag += option.long_name + '=' + option.metavar;
      } else {
        flag += option.long_name;
      }
    }

    // +2 for "--" of the long flag name.
    size_t remaining = longest_name_length + kExtraSpace + 2 - flag.size();
    line += flag + std::string(remaining, ' ');

    if (!option.help.empty()) {
      line += option.help;
    }
    printf("%s\n", line.c_str());
  }
}